

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCryptionCommon.cpp
# Opt level: O2

ByteList * __thiscall
XCryptionCommon::algorithm3_3
          (ByteList *__return_storage_ptr__,XCryptionCommon *this,uint inRevision,uint inLength,
          ByteList *inOwnerPassword,ByteList *inUserPassword)

{
  ulong uVar1;
  LongBufferSizeType inLength_00;
  ByteList *pBVar2;
  byte bVar3;
  int iVar4;
  XCryptionCommon *pXVar5;
  _List_node_base *p_Var6;
  bool bVar7;
  ByteList newRC4Key;
  ByteList userPassword32Chars;
  ByteList ownerPassword32Chars;
  ByteList RC4Key;
  undefined1 local_110 [24];
  MD5Generator md5;
  
  substr((ByteList *)&md5,inOwnerPassword,0,0x20);
  uVar1 = (inOwnerPassword->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
          ._M_node._M_size;
  if (uVar1 < 0x20) {
    substr(&RC4Key,&this->mPaddingFiller,0,0x20 - uVar1);
  }
  else {
    RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&RC4Key;
    RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node._M_size =
         0;
    RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
         super__List_node_base._M_next;
  }
  add(&ownerPassword32Chars,(ByteList *)&md5,&RC4Key);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&RC4Key);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&md5);
  substr((ByteList *)&md5,inUserPassword,0,0x20);
  uVar1 = (inUserPassword->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          _M_node._M_size;
  if (uVar1 < 0x20) {
    substr(&RC4Key,&this->mPaddingFiller,0,0x20 - uVar1);
  }
  else {
    RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node._M_size =
         0;
    RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&RC4Key;
    RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)&RC4Key;
  }
  add(&userPassword32Chars,(ByteList *)&md5,&RC4Key);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            (&RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&md5);
  MD5Generator::MD5Generator(&md5);
  (__return_storage_ptr__->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  _M_node._M_size = 0;
  MD5Generator::Accumulate(&md5,&ownerPassword32Chars);
  pBVar2 = MD5Generator::ToString_abi_cxx11_(&md5);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (__return_storage_ptr__,pBVar2);
  if (2 < inRevision) {
    iVar4 = 0x32;
    while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
      MD5Generator::MD5Generator((MD5Generator *)&RC4Key);
      MD5Generator::Accumulate((MD5Generator *)&RC4Key,__return_storage_ptr__);
      pBVar2 = MD5Generator::ToString_abi_cxx11_((MD5Generator *)&RC4Key);
      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (__return_storage_ptr__,pBVar2);
      MD5Generator::~MD5Generator((MD5Generator *)&RC4Key);
    }
  }
  inLength_00 = (ulong)inLength;
  if (inRevision == 2) {
    inLength_00 = 5;
  }
  pXVar5 = (XCryptionCommon *)__return_storage_ptr__;
  substr(&RC4Key,__return_storage_ptr__,0,inLength_00);
  RC4Encode(&newRC4Key,pXVar5,&RC4Key,&userPassword32Chars);
  pXVar5 = (XCryptionCommon *)&newRC4Key;
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (__return_storage_ptr__);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&newRC4Key);
  if (2 < inRevision) {
    for (bVar3 = 1; bVar3 != 0x14; bVar3 = bVar3 + 1) {
      newRC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
      _M_size = 0;
      p_Var6 = (_List_node_base *)&RC4Key;
      newRC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)&newRC4Key;
      newRC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
      super__List_node_base._M_prev = (_List_node_base *)&newRC4Key;
      while (p_Var6 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var6 != (_List_node_base *)&RC4Key) {
        local_110[0] = *(byte *)&p_Var6[1]._M_next ^ bVar3;
        pXVar5 = (XCryptionCommon *)local_110;
        std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((list<unsigned_char,_std::allocator<unsigned_char>_> *)&newRC4Key,
                   (value_type_conflict3 *)local_110);
      }
      RC4Encode((ByteList *)local_110,pXVar5,&newRC4Key,__return_storage_ptr__);
      pXVar5 = (XCryptionCommon *)local_110;
      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (__return_storage_ptr__);
      std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
                ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_110);
      std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
                ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&newRC4Key);
    }
  }
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            (&RC4Key.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>);
  MD5Generator::~MD5Generator(&md5);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            (&userPassword32Chars.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
            (&ownerPassword32Chars.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

ByteList XCryptionCommon::algorithm3_3(unsigned int inRevision,
	unsigned int inLength,
	const ByteList& inOwnerPassword,
	const ByteList& inUserPassword) {
	ByteList ownerPassword32Chars = add(substr(inOwnerPassword, 0, 32), (inOwnerPassword.size()<32 ? substr(mPaddingFiller, 0, 32 - inOwnerPassword.size()) : ByteList()));
	ByteList userPassword32Chars = add(substr(inUserPassword, 0, 32), (inUserPassword.size()<32 ? substr(mPaddingFiller, 0, 32 - inUserPassword.size()) : ByteList()));
	MD5Generator md5;
	ByteList hashResult;

	md5.Accumulate(ownerPassword32Chars);

	hashResult = md5.ToString();

	if (inRevision >= 3) {
		for (int i = 0; i < 50; ++i) {
			MD5Generator anotherMD5;
			anotherMD5.Accumulate(hashResult);
			hashResult = anotherMD5.ToString();
		}
	}

	ByteList RC4Key = (inRevision == 2 ? substr(hashResult, 0, 5) : substr(hashResult, 0, inLength));

	hashResult = RC4Encode(RC4Key, userPassword32Chars);

	if (inRevision >= 3) {
		for (Byte i = 1; i <= 19; ++i) {
			ByteList newRC4Key;
			ByteList::iterator it = RC4Key.begin();
			for (; it != RC4Key.end(); ++it)
				newRC4Key.push_back((*it) ^ i);
			hashResult = RC4Encode(newRC4Key, hashResult);
		}
	}

	return hashResult;
}